

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O3

void __thiscall Tag::~Tag(Tag *this)

{
  StreamObject *pSVar1;
  pointer pcVar2;
  pointer ppSVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint uVar5;
  pointer ppSVar6;
  ulong uVar7;
  
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_0010ab60;
  ppSVar6 = (this->_streamObjects).
            super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar3 = (this->_streamObjects).
            super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar3 != ppSVar6) {
    uVar5 = 1;
    uVar7 = 0;
    do {
      pSVar1 = ppSVar6[uVar7];
      if (pSVar1 != (StreamObject *)0x0) {
        pSVar1->_vptr_StreamObject = (_func_int **)&PTR_write_0010ab00;
        pcVar2 = (pSVar1->_name)._M_dataplus._M_p;
        paVar4 = &(pSVar1->_name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar4) {
          operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
        }
        operator_delete(pSVar1,0x40);
        (this->_streamObjects).super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar7] = (StreamObject *)0x0;
        ppSVar6 = (this->_streamObjects).
                  super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppSVar3 = (this->_streamObjects).
                  super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar7 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar7 < (ulong)((long)ppSVar3 - (long)ppSVar6 >> 3));
  }
  if (ppSVar6 != (pointer)0x0) {
    operator_delete(ppSVar6,(long)(this->_streamObjects).
                                  super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar6
                   );
  }
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_0010ab00;
  pcVar2 = (this->super_StreamObject)._name._M_dataplus._M_p;
  paVar4 = &(this->super_StreamObject)._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Tag::~Tag()
{
	//std::cout << __PRETTY_FUNCTION__ << std::endl;

	for ( unsigned int i = 0; i < _streamObjects.size();i++ )
	{
		if ( _streamObjects[i] != NULL )
		{
			delete _streamObjects[i];
			_streamObjects[i] = NULL;
		}
	}
}